

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O1

integer pow_ii(integer *ap,integer *bp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  
  iVar3 = *ap;
  uVar6 = *bp;
  if ((int)uVar6 < 1) {
    if (iVar3 == 1 || uVar6 == 0) {
      return 1;
    }
    if (iVar3 != -1) {
      if (iVar3 == 0) {
        return 0;
      }
      iVar2 = 0;
      if (iVar3 + 1U < 3) {
        iVar2 = iVar3;
      }
      return iVar2;
    }
    uVar6 = -uVar6;
  }
  uVar4 = (ulong)uVar6;
  iVar2 = iVar3;
  if ((uVar6 & 1) == 0) {
    iVar2 = 1;
  }
  if (1 < uVar6) {
    do {
      iVar3 = iVar3 * iVar3;
      iVar5 = iVar3;
      if ((uVar4 & 2) == 0) {
        iVar5 = 1;
      }
      iVar2 = iVar2 * iVar5;
      bVar1 = 3 < uVar4;
      uVar4 = uVar4 >> 1;
    } while (bVar1);
  }
  return iVar2;
}

Assistant:

integer pow_ii(ap, bp) integer *ap, *bp;
#else
    integer pow_ii(integer * ap, integer * bp)
#endif
    {
        integer pow, x, n;
        unsigned long u;

         x = *ap;
         n = *bp;

        if (n <= 0) {
            if (n == 0 || x == 1)
                return 1;
            if (x != -1)
                return x != 0 ? 1 / x : 0;
            n = -n;
        }